

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

boolean dig_corridor(level *lev,coord *org,coord *dest,boolean nxcor,schar ftyp,schar btyp)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  schar *psVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  schar *psVar15;
  char *pcVar16;
  uint uVar17;
  uint x;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  uint uVar25;
  uint y;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  int local_dc;
  
  cVar1 = org->x;
  cVar2 = org->y;
  cVar3 = dest->x;
  cVar4 = dest->y;
  uVar27 = 0;
  if ('\x14' < cVar4 ||
      (('\x14' < cVar2 || ('O' < cVar3 || 0x4f < cVar1)) ||
      ((cVar4 < '\x01' || cVar3 < '\x01') || (cVar2 < '\x01' || cVar1 < '\x01')))) {
LAB_0023aaac:
    return (boolean)uVar27;
  }
  uVar6 = (uint)cVar4;
  uVar8 = 1;
  if (cVar3 <= cVar1) {
    uVar8 = 0;
    if (cVar2 < cVar4) {
      uVar27 = 1;
    }
    else {
      uVar27 = -(uint)(cVar1 <= cVar3);
      uVar8 = -(uint)(cVar3 < cVar1);
    }
  }
  uVar25 = (uint)cVar3;
  uVar18 = (ulong)((int)cVar1 - uVar8);
  uVar26 = (ulong)((int)cVar2 - uVar27);
  uVar14 = 0;
LAB_0023a392:
  uVar21 = (ulong)((int)uVar26 + uVar27 * 2);
  iVar7 = (int)uVar14 + -1;
  iVar10 = uVar27 + (int)uVar26 + 1;
  while( true ) {
    iVar19 = iVar10;
    uVar12 = uVar8;
    local_dc = iVar7;
    uVar20 = uVar21;
    uVar17 = (uint)uVar18;
    uVar28 = (uint)uVar26;
    if ((uVar17 == uVar25) && (uVar6 == uVar28)) {
      uVar27 = 1;
      goto LAB_0023aaac;
    }
    iVar7 = local_dc + 1;
    if (500 < iVar7) break;
    if ((nxcor != '\0') && (uVar8 = mt_random(), uVar8 % 0x23 == 0)) goto LAB_0023aaa9;
    x = uVar17 + uVar12;
    uVar18 = (ulong)x;
    if (((uVar17 + uVar12) - 0x4f < 0xffffffb2) || ((uVar27 - 0x14) + uVar28 < 0xffffffed)) {
      if (nxcor == '\0') {
        pcVar16 = "dig_corridor: hit level edge [%d,%d]";
LAB_0023aaa2:
        warning(pcVar16,(ulong)x,(ulong)(uVar27 + uVar28));
      }
      goto LAB_0023aaa9;
    }
    y = uVar27 + uVar28;
    uVar26 = (ulong)y;
    cVar1 = lev->locations[uVar18][uVar26].typ;
    if (cVar1 == btyp) {
      psVar11 = &lev->locations[uVar18][uVar26].typ;
      if ((ftyp == '\x18') && (uVar8 = mt_random(), uVar8 % 100 == 0)) {
        *psVar11 = '\x18';
      }
      else {
        *psVar11 = ftyp;
        if ((nxcor != '\0') && (uVar8 = mt_random(), uVar8 % 0x32 == 0)) {
          mksobj_at(0x214,lev,x,y,'\x01','\0');
        }
      }
    }
    else if (cVar1 != '\x10' && cVar1 != ftyp) {
      if (nxcor == '\0') {
        pcVar16 = "dig_corridor: trying to dig disallowed tile [%d,%d]";
        goto LAB_0023aaa2;
      }
      goto LAB_0023aaa9;
    }
    uVar9 = x - uVar25;
    uVar8 = -uVar9;
    if (0 < (int)uVar9) {
      uVar8 = uVar9;
    }
    uVar13 = (uVar27 - uVar6) + uVar28;
    uVar9 = -uVar13;
    if (0 < (int)uVar13) {
      uVar9 = uVar13;
    }
    if (uVar27 == 0) {
LAB_0023a5b2:
      if (uVar12 == 0) {
        uVar9 = 0;
      }
      else if (((uVar8 < uVar9) || (((int)uVar12 < 0 && ((int)x < (int)uVar25)))) ||
              ((uVar9 = uVar12, 0 < (int)uVar12 && (uVar9 = 1, (int)uVar25 < (int)x)))) {
        uVar13 = (uint)((int)y <= (int)uVar6) * 2 - 1;
        cVar1 = lev->locations[uVar18][uVar27 + (uint)((int)y <= (int)uVar6) * 2 + -1 + uVar28].typ;
        uVar8 = 0;
        if ((cVar1 != '\x10') && (cVar1 != btyp)) goto joined_r0x0023a629;
        goto LAB_0023aa32;
      }
    }
    else {
      if (((uVar8 <= uVar9) && (-1 < (int)uVar27 || (int)uVar6 <= (int)y)) &&
         ((int)uVar27 < 1 || (int)y <= (int)uVar6)) goto LAB_0023a5b2;
      uVar8 = (uint)((int)x <= (int)uVar25) * 2 - 1;
      cVar1 = lev->locations[(x + (uint)((int)x <= (int)uVar25) * 2) - 1][uVar26].typ;
      uVar13 = 0;
      if ((cVar1 == '\x10') || (cVar1 == btyp)) goto LAB_0023aa32;
joined_r0x0023a629:
      uVar9 = uVar12;
      if (cVar1 == ftyp) goto LAB_0023aa32;
    }
    cVar1 = lev->locations[uVar9 + x][uVar28 + uVar27 * 2].typ;
    iVar10 = uVar27 + iVar19;
    uVar21 = (ulong)((int)uVar20 + uVar27);
    uVar8 = uVar9;
    if (((cVar1 != '\x10') && (cVar1 != btyp)) && (cVar1 != ftyp)) goto LAB_0023a6f3;
  }
  if (nxcor == '\0') {
    uVar18 = 0x1f5;
    if (0x1f5 < (int)uVar14) {
      uVar18 = uVar14;
    }
    warning("dig_corridor: giving up after %d tries",uVar18);
  }
LAB_0023aaa9:
  uVar27 = 0;
  goto LAB_0023aaac;
LAB_0023a6f3:
  if (uVar9 == 0) {
    if (uVar6 == y) {
      bVar23 = (int)uVar25 < (int)x;
      bVar24 = (int)x <= (int)uVar25;
    }
    else {
      pcVar16 = (char *)((long)lev + uVar20 * 0xc + uVar18 * 0xfc + -0xb8);
      psVar11 = &lev->locations[uVar18 + 1][uVar20].typ;
      bVar23 = false;
      iVar7 = 1;
      bVar24 = false;
      lVar22 = 0x4e;
      while ((lVar22 != 0 && ((!bVar23 || (!bVar24))))) {
        if ((lVar22 + uVar18 != 0x4f && -1 < (long)(lVar22 + uVar18 + -0x4f)) &&
           (bVar5 = !bVar23, bVar23 = true, bVar5)) {
          if ((uVar18 - 0x4d) + lVar22 == 3) {
            bVar23 = false;
          }
          else {
            cVar1 = *pcVar16;
            bVar23 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
          }
        }
        if (((int)(iVar7 + x) < 0x4f) && (bVar5 = !bVar24, bVar24 = true, bVar5)) {
          if (lVar22 + (0x4d - uVar18) == 0x4e) {
            bVar24 = false;
          }
          else {
            cVar1 = *psVar11;
            bVar24 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
          }
        }
        iVar7 = iVar7 + 1;
        pcVar16 = pcVar16 + -0xfc;
        psVar11 = psVar11 + 0xfc;
        lVar22 = lVar22 + -1;
      }
    }
    if (((nxcor == '\0') && (!bVar23)) && (!bVar24)) {
      warning("dig_corridor: vertical corridor blocked");
    }
    uVar8 = -(uint)(byte)(~bVar24 | (int)uVar25 < (int)x & bVar23) | 1;
    uVar13 = 0;
  }
  else {
    if (x == uVar25) {
      bVar23 = (int)uVar6 < (int)y;
      bVar24 = (int)y <= (int)uVar6;
    }
    else {
      uVar14 = (ulong)(uVar9 + uVar12 + uVar17);
      psVar15 = &lev->locations[uVar14 - 1][uVar26 + 0x14].typ;
      psVar11 = &lev->locations[uVar14][uVar26 + 1].typ;
      bVar23 = false;
      bVar24 = false;
      lVar22 = 0x13;
      while ((lVar22 != 0 && ((!bVar23 || (!bVar24))))) {
        if ((uVar26 + lVar22 != 0x14 && -1 < (long)(uVar26 + lVar22 + -0x14)) &&
           (bVar5 = !bVar23, bVar23 = true, bVar5)) {
          if ((uVar26 - 0x12) + lVar22 == 3) {
            bVar23 = false;
          }
          else {
            cVar1 = *psVar15;
            bVar23 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
          }
        }
        if ((iVar19 < 0x14) && (bVar5 = !bVar24, bVar24 = true, bVar5)) {
          if (lVar22 + (0x12 - uVar26) == 0x13) {
            bVar24 = false;
          }
          else {
            cVar1 = *psVar11;
            bVar24 = cVar1 == '\x10' || (cVar1 == ftyp || cVar1 == btyp);
          }
        }
        psVar15 = psVar15 + -0xc;
        psVar11 = psVar11 + 0xc;
        iVar19 = iVar19 + 1;
        lVar22 = lVar22 + -1;
      }
    }
    if (((nxcor == '\0') && (!bVar23)) && (!bVar24)) {
      warning("dig_corridor: horizontal corridor blocked");
    }
    uVar13 = -(uint)(byte)(~bVar24 | (int)uVar6 < (int)y & bVar23) | 1;
    uVar8 = 0;
  }
  cVar1 = lev->locations[uVar8 + x][uVar13 + y].typ;
  if (((cVar1 != '\x10') && (cVar1 != btyp)) && (cVar1 != ftyp)) {
    uVar13 = -uVar13;
    uVar8 = -uVar8;
  }
LAB_0023aa32:
  uVar14 = (ulong)(local_dc + 2);
  uVar27 = uVar13;
  goto LAB_0023a392;
}

Assistant:

boolean dig_corridor(struct level *lev, coord *org, coord *dest, boolean nxcor,
		     schar ftyp, schar btyp)
{
	int dx = 0, dy = 0, dix, diy, cct;
	struct rm *crm;
	int tx, ty, xx, yy;

	xx = org->x;
	yy = org->y;
	tx = dest->x;
	ty = dest->y;
	if (xx <= 0 || yy <= 0 || tx <= 0 || ty <= 0 ||
	    xx > COLNO - 1 || tx > COLNO - 1 ||
	    yy > ROWNO - 1 || ty > ROWNO - 1)
	    return FALSE;

	if (tx > xx)		dx = 1;
	else if (ty > yy)	dy = 1;
	else if (tx < xx)	dx = -1;
	else			dy = -1;

	xx -= dx;
	yy -= dy;
	cct = 0;
	while (xx != tx || yy != ty) {
	    /* loop: dig corridor at [xx,yy] and find new [xx,yy] */
	    if (cct++ > 500 || (nxcor && !rn2(35))) {
		if (!nxcor)
		    warning("dig_corridor: giving up after %d tries", cct - 1);
		return FALSE;
	    }

	    xx += dx;
	    yy += dy;

	    if (xx >= COLNO - 1 || xx <= 0 || yy <= 0 || yy >= ROWNO - 1) {
		/* should be impossible */
		if (!nxcor)
		    warning("dig_corridor: hit level edge [%d,%d]", xx, yy);
		return FALSE;
	    }

	    crm = &lev->locations[xx][yy];
	    if (crm->typ == btyp) {
		if (ftyp != CORR || rn2(100)) {
		    crm->typ = ftyp;
		    if (nxcor && !rn2(50))
			mksobj_at(BOULDER, lev, xx, yy, TRUE, FALSE);
		} else {
		    crm->typ = CORR;	/* formerly secret corridor */
		}
	    } else
	    if (crm->typ != ftyp && crm->typ != SCORR) {
		/* strange ... */
		if (!nxcor) {
		    warning("dig_corridor: trying to dig disallowed tile [%d,%d]",
			    xx, yy);
		}
		return FALSE;
	    }

	    /* find next corridor position */
	    dix = abs(xx-tx);
	    diy = abs(yy-ty);

	    /* do we have to change direction ? */
	    if (dy && (dix > diy ||
		       (dy < 0 && yy < ty) ||
		       (dy > 0 && yy > ty))) {
		int ddx = (xx > tx) ? -1 : 1;

		crm = &lev->locations[xx + ddx][yy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dx = ddx;
		    dy = 0;
		    continue;
		}
	    } else if (dx && (diy > dix ||
			      (dx < 0 && xx < tx) ||
			      (dx > 0 && xx > tx))) {
		int ddy = (yy > ty) ? -1 : 1;

		crm = &lev->locations[xx][yy + ddy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dy = ddy;
		    dx = 0;
		    continue;
		}
	    }

	    /* continue straight on? */
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;

	    /* no, what must we do now?? */
	    if (dx) {
		/* should we go up or down? */
		boolean upok = FALSE;
		boolean downok = FALSE;
		if (xx == tx) {
		    if (yy > ty) upok = TRUE;
		    else downok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < ROWNO - 1; i++) {
			if (upok && downok)
			    break;
			if (yy - i > 0) {
			    crm = &lev->locations[xx + dx][yy - i];
			    if (!upok &&
				yy - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				upok = TRUE;
			}
			if (yy + i < ROWNO - 1) {
			    crm = &lev->locations[xx + dx][yy + i];
			    if (!downok &&
				yy + i + 1 < ROWNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				downok = TRUE;
			}
		    }
		}
		if (!nxcor && !upok && !downok)
		    warning("dig_corridor: horizontal corridor blocked");
		dx = 0;
		dy = ((yy > ty && upok) || !downok) ? -1 : 1;
	    } else {
		/* should we go left or right? */
		boolean leftok = FALSE;
		boolean rightok = FALSE;
		if (yy == ty) {
		    if (xx > tx) leftok = TRUE;
		    else rightok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < COLNO - 1; i++) {
			if (leftok && rightok)
			    break;
			if (xx - i > 0) {
			    crm = &lev->locations[xx - i][yy + dy];
			    if (!leftok &&
				xx - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				leftok = TRUE;
			}
			if (xx + i < COLNO - 1) {
			    crm = &lev->locations[xx + i][yy + dy];
			    if (!rightok &&
				xx + i + 1 < COLNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				rightok = TRUE;
			}
		    }
		}
		if (!nxcor && !leftok && !rightok)
		    warning("dig_corridor: vertical corridor blocked");
		dx = ((xx > tx && leftok) || !rightok) ? -1 : 1;
		dy = 0;
	    }
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;
	    dy = -dy;
	    dx = -dx;
	}
	return TRUE;
}